

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utils.cpp
# Opt level: O1

void EvaluatePolicy(CMDP *PolicyMDP,int StartStateID,int GoalStateID,double *PolValue,
                   bool *bFullPolicy,double *Pcgoal,int *nMerges,bool *bCycles)

{
  CMDPSTATE *sourcestate;
  CMDPACTION *pCVar1;
  long lVar2;
  bool bVar3;
  void *__s;
  void *pvVar4;
  pointer ppCVar5;
  pointer ppCVar6;
  runtime_error *this;
  SBPL_Exception *this_00;
  double *pdVar7;
  uint uVar8;
  CMDPSTATE *targetstate;
  double *pdVar9;
  int iVar10;
  ulong uVar11;
  long lVar12;
  ulong uVar13;
  ulong uVar14;
  long lVar15;
  bool bVar16;
  double dVar17;
  undefined8 uVar18;
  double dVar19;
  stringstream ss;
  double local_228;
  long *local_1f8 [2];
  long local_1e8 [2];
  long local_1d8;
  double *local_1d0;
  double *local_1c8;
  long local_1c0;
  stringstream local_1b8 [16];
  ostream local_1a8 [376];
  
  *Pcgoal = 0.0;
  *nMerges = 0;
  ppCVar5 = (PolicyMDP->StateArray).super__Vector_base<CMDPSTATE_*,_std::allocator<CMDPSTATE_*>_>.
            _M_impl.super__Vector_impl_data._M_start;
  uVar13 = (long)(PolicyMDP->StateArray).
                 super__Vector_base<CMDPSTATE_*,_std::allocator<CMDPSTATE_*>_>._M_impl.
                 super__Vector_impl_data._M_finish - (long)ppCVar5;
  uVar14 = -(ulong)((ulong)((long)uVar13 >> 3) >> 0x3d != 0) | uVar13;
  local_1c8 = Pcgoal;
  __s = operator_new__(uVar14);
  pvVar4 = operator_new__(uVar14);
  uVar8 = (uint)((long)uVar13 >> 3);
  if ((int)uVar8 < 1) {
    local_1d8 = -1;
  }
  else {
    uVar14 = 0;
    memset(__s,0,uVar13 & 0x3fffffff8);
    uVar13 = 0xffffffff;
    do {
      *(undefined8 *)((long)pvVar4 + uVar14 * 8) = 0;
      uVar18 = 0x3ff0000000000000;
      bVar16 = ppCVar5[uVar14]->StateID != StartStateID;
      if (bVar16) {
        uVar18 = 0;
      }
      *(undefined8 *)((long)pvVar4 + uVar14 * 8) = uVar18;
      if (!bVar16) {
        uVar13 = uVar14 & 0xffffffff;
      }
      uVar14 = uVar14 + 1;
    } while ((uVar8 & 0x7fffffff) != uVar14);
    local_1d8 = (long)(int)uVar13;
  }
  *bFullPolicy = true;
  local_1d0 = (double *)((long)__s + local_1d8 * 8);
  bVar16 = true;
  do {
    ppCVar5 = (PolicyMDP->StateArray).super__Vector_base<CMDPSTATE_*,_std::allocator<CMDPSTATE_*>_>.
              _M_impl.super__Vector_impl_data._M_start;
    uVar13 = (ulong)((long)(PolicyMDP->StateArray).
                           super__Vector_base<CMDPSTATE_*,_std::allocator<CMDPSTATE_*>_>._M_impl.
                           super__Vector_impl_data._M_finish - (long)ppCVar5) >> 3;
    if ((int)uVar13 < 1) break;
    local_228 = 0.0;
    lVar12 = 0;
    do {
      sourcestate = ppCVar5[lVar12];
      if (sourcestate->StateID == GoalStateID) {
        *(undefined8 *)((long)__s + lVar12 * 8) = 0;
LAB_00141a33:
        local_1c0 = lVar12;
        if ((int)((ulong)((long)(PolicyMDP->StateArray).
                                super__Vector_base<CMDPSTATE_*,_std::allocator<CMDPSTATE_*>_>.
                                _M_impl.super__Vector_impl_data._M_finish -
                         (long)(PolicyMDP->StateArray).
                               super__Vector_base<CMDPSTATE_*,_std::allocator<CMDPSTATE_*>_>._M_impl
                               .super__Vector_impl_data._M_start) >> 3) < 1) {
          iVar10 = 0;
          dVar17 = 0.0;
        }
        else {
          dVar17 = 0.0;
          lVar12 = 0;
          iVar10 = 0;
          do {
            targetstate = (PolicyMDP->StateArray).
                          super__Vector_base<CMDPSTATE_*,_std::allocator<CMDPSTATE_*>_>._M_impl.
                          super__Vector_impl_data._M_start[lVar12];
            ppCVar6 = (targetstate->Actions).
                      super__Vector_base<CMDPACTION_*,_std::allocator<CMDPACTION_*>_>._M_impl.
                      super__Vector_impl_data._M_start;
            if (0 < (int)((ulong)((long)(targetstate->Actions).
                                        super__Vector_base<CMDPACTION_*,_std::allocator<CMDPACTION_*>_>
                                        ._M_impl.super__Vector_impl_data._M_finish - (long)ppCVar6)
                         >> 3)) {
              lVar15 = 0;
              do {
                pCVar1 = *ppCVar6;
                lVar2 = *(long *)&(pCVar1->SuccsID).super__Vector_base<int,_std::allocator<int>_>.
                                  _M_impl.super__Vector_impl_data;
                if ((int)((ulong)((long)*(pointer *)
                                         ((long)&(pCVar1->SuccsID).
                                                 super__Vector_base<int,_std::allocator<int>_>.
                                                 _M_impl + 8) - lVar2) >> 2) <= lVar15) break;
                if (*(int *)(lVar2 + lVar15 * 4) == sourcestate->StateID) {
                  dVar17 = (double)*(float *)(*(long *)&(pCVar1->SuccsProb).
                                                                                                                
                                                  super__Vector_base<float,_std::allocator<float>_>.
                                                  _M_impl.super__Vector_impl_data + lVar15 * 4) *
                           *(double *)((long)pvVar4 + lVar12 * 8) + dVar17;
                  iVar10 = iVar10 + 1;
                  if (((bVar16) && (*bCycles == false)) &&
                     (bVar3 = PathExists(PolicyMDP,sourcestate,targetstate), bVar3)) {
                    *bCycles = true;
                  }
                }
                lVar15 = lVar15 + 1;
                targetstate = (PolicyMDP->StateArray).
                              super__Vector_base<CMDPSTATE_*,_std::allocator<CMDPSTATE_*>_>._M_impl.
                              super__Vector_impl_data._M_start[lVar12];
                ppCVar6 = (targetstate->Actions).
                          super__Vector_base<CMDPACTION_*,_std::allocator<CMDPACTION_*>_>._M_impl.
                          super__Vector_impl_data._M_start;
              } while (0 < (int)((ulong)((long)(targetstate->Actions).
                                               super__Vector_base<CMDPACTION_*,_std::allocator<CMDPACTION_*>_>
                                               ._M_impl.super__Vector_impl_data._M_finish -
                                        (long)ppCVar6) >> 3));
            }
            lVar12 = lVar12 + 1;
          } while (lVar12 < (int)((ulong)((long)(PolicyMDP->StateArray).
                                                super__Vector_base<CMDPSTATE_*,_std::allocator<CMDPSTATE_*>_>
                                                ._M_impl.super__Vector_impl_data._M_finish -
                                         (long)(PolicyMDP->StateArray).
                                               super__Vector_base<CMDPSTATE_*,_std::allocator<CMDPSTATE_*>_>
                                               ._M_impl.super__Vector_impl_data._M_start) >> 3));
        }
        if ((bVar16) && (0 < iVar10 && sourcestate->StateID != GoalStateID)) {
          *nMerges = *nMerges + iVar10 + -1;
        }
        iVar10 = sourcestate->StateID;
        if (iVar10 != StartStateID) {
          *(double *)((long)pvVar4 + local_1c0 * 8) = dVar17;
        }
        bVar3 = true;
        lVar12 = local_1c0;
        if (iVar10 == GoalStateID) {
          bVar3 = true;
          pdVar7 = (double *)((long)pvVar4 + local_1c0 * 8);
          pdVar9 = local_1c8;
          goto LAB_00141bb2;
        }
      }
      else {
        ppCVar6 = (sourcestate->Actions).
                  super__Vector_base<CMDPACTION_*,_std::allocator<CMDPACTION_*>_>._M_impl.
                  super__Vector_impl_data._M_start;
        if ((int)((ulong)((long)(sourcestate->Actions).
                                super__Vector_base<CMDPACTION_*,_std::allocator<CMDPACTION_*>_>.
                                _M_impl.super__Vector_impl_data._M_finish - (long)ppCVar6) >> 3) !=
            0) {
          pCVar1 = *ppCVar6;
          lVar15 = *(long *)&(pCVar1->SuccsID).super__Vector_base<int,_std::allocator<int>_>._M_impl
                             .super__Vector_impl_data;
          uVar8 = (uint)((ulong)((long)*(pointer *)
                                        ((long)&(pCVar1->SuccsID).
                                                super__Vector_base<int,_std::allocator<int>_>.
                                                _M_impl + 8) - lVar15) >> 2);
          if ((int)uVar8 < 1) {
            dVar17 = 0.0;
          }
          else {
            dVar17 = 0.0;
            uVar14 = 0;
            do {
              if ((int)uVar13 < 1) {
                uVar11 = 0;
              }
              else {
                uVar11 = 0;
                do {
                  if (ppCVar5[uVar11]->StateID == *(int *)(lVar15 + uVar14 * 4)) goto LAB_001419a2;
                  uVar11 = uVar11 + 1;
                } while ((uVar13 & 0xffffffff) != uVar11);
                uVar11 = uVar13 & 0xffffffff;
              }
LAB_001419a2:
              if ((int)uVar11 == (int)uVar13) {
                local_1f8[0] = local_1e8;
                std::__cxx11::string::_M_construct<char_const*>
                          ((string *)local_1f8,"ERROR in EvaluatePolicy: incorrect successor ","");
                std::__cxx11::stringstream::stringstream(local_1b8,(string *)local_1f8,_S_out|_S_in)
                ;
                if (local_1f8[0] != local_1e8) {
                  operator_delete(local_1f8[0],local_1e8[0] + 1);
                }
                std::ostream::operator<<
                          (local_1a8,
                           *(int *)(*(long *)&(pCVar1->SuccsID).
                                              super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                              super__Vector_impl_data + (uVar14 & 0xffffffff) * 4));
                this = (runtime_error *)__cxa_allocate_exception(0x10);
                std::__cxx11::stringbuf::str();
                std::runtime_error::runtime_error(this,(string *)local_1f8);
                *(undefined ***)this = &PTR__runtime_error_001574d0;
                __cxa_throw(this,&SBPL_Exception::typeinfo,std::runtime_error::~runtime_error);
              }
              dVar17 = dVar17 + ((double)*(int *)(*(long *)&(pCVar1->Costs).
                                                                                                                        
                                                  super__Vector_base<int,_std::allocator<int>_>.
                                                  _M_impl.super__Vector_impl_data + uVar14 * 4) +
                                *(double *)((long)__s + (uVar11 & 0xffffffff) * 8)) *
                                (double)*(float *)(*(long *)&(pCVar1->SuccsProb).
                                                                                                                          
                                                  super__Vector_base<float,_std::allocator<float>_>.
                                                  _M_impl.super__Vector_impl_data + uVar14 * 4);
              uVar14 = uVar14 + 1;
            } while (uVar14 != (uVar8 & 0x7fffffff));
          }
          dVar19 = *(double *)((long)__s + lVar12 * 8);
          if (dVar17 < dVar19) {
            this_00 = (SBPL_Exception *)__cxa_allocate_exception(0x10);
            SBPL_Exception::SBPL_Exception(this_00,"ERROR in EvaluatePolicy: val is decreasing");
            __cxa_throw(this_00,&SBPL_Exception::typeinfo,std::runtime_error::~runtime_error);
          }
          dVar19 = dVar17 - dVar19;
          if (dVar19 <= local_228) {
            dVar19 = local_228;
          }
          *(double *)((long)__s + lVar12 * 8) = dVar17;
          local_228 = dVar19;
          goto LAB_00141a33;
        }
        *bFullPolicy = false;
        *(undefined8 *)((long)__s + lVar12 * 8) = 0x412e848000000000;
        bVar3 = false;
        pdVar7 = local_1d0;
        pdVar9 = PolValue;
LAB_00141bb2:
        *pdVar9 = *pdVar7;
      }
      if (!bVar3) {
        return;
      }
      lVar12 = lVar12 + 1;
      ppCVar5 = (PolicyMDP->StateArray).
                super__Vector_base<CMDPSTATE_*,_std::allocator<CMDPSTATE_*>_>._M_impl.
                super__Vector_impl_data._M_start;
      uVar13 = (ulong)((long)(PolicyMDP->StateArray).
                             super__Vector_base<CMDPSTATE_*,_std::allocator<CMDPSTATE_*>_>._M_impl.
                             super__Vector_impl_data._M_finish - (long)ppCVar5) >> 3;
    } while (lVar12 < (int)uVar13);
    bVar16 = false;
  } while (0.1 < local_228);
  *PolValue = *(double *)((long)__s + local_1d8 * 8);
  return;
}

Assistant:

void EvaluatePolicy(CMDP* PolicyMDP, int StartStateID, int GoalStateID, double* PolValue, bool *bFullPolicy,
                    double* Pcgoal, int *nMerges, bool* bCycles)
{
    int i, j, startind = -1;
    double delta = INFINITECOST;
    double mindelta = 0.1;

    *Pcgoal = 0;
    *nMerges = 0;

    SBPL_PRINTF("Evaluating policy...\n");

    //create and initialize values
    double* vals = new double[PolicyMDP->StateArray.size()];
    double* Pcvals = new double[PolicyMDP->StateArray.size()];
    for (i = 0; i < (int)PolicyMDP->StateArray.size(); i++) {
        vals[i] = 0;
        Pcvals[i] = 0;

        //remember the start index
        if (PolicyMDP->StateArray[i]->StateID == StartStateID) {
            startind = i;
            Pcvals[i] = 1;
        }
    }

    //initially assume full policy
    *bFullPolicy = true;
    bool bFirstIter = true;
    while (delta > mindelta) {
        delta = 0;
        for (i = 0; i < (int)PolicyMDP->StateArray.size(); i++) {
            //get the state
            CMDPSTATE* state = PolicyMDP->StateArray[i];

            //do the backup for values
            if (state->StateID == GoalStateID) {
                vals[i] = 0;
            }
            else if ((int)state->Actions.size() == 0) {
                *bFullPolicy = false;
                vals[i] = UNKNOWN_COST;
                *PolValue = vals[startind];
                return;
            }
            else {
                //normal backup
                CMDPACTION* action = state->Actions[0];

                //do backup
                double Q = 0;
                for (int oind = 0; oind < (int)action->SuccsID.size(); oind++) {
                    //get the state
                    for (j = 0; j < (int)PolicyMDP->StateArray.size(); j++) {
                        if (PolicyMDP->StateArray[j]->StateID == action->SuccsID[oind]) break;
                    }
                    if (j == (int)PolicyMDP->StateArray.size()) {
                        std::stringstream ss("ERROR in EvaluatePolicy: incorrect successor ");
                        ss << action->SuccsID[oind];
                        throw SBPL_Exception(ss.str());
                    }
                    Q += action->SuccsProb[oind] * (vals[j] + action->Costs[oind]);
                }

                if (vals[i] > Q) {
                    throw SBPL_Exception("ERROR in EvaluatePolicy: val is decreasing");
                }

                //update delta
                if (delta < Q - vals[i]) delta = Q - vals[i];

                //set the value
                vals[i] = Q;
            }

            //iterate through all the predecessors and compute Pc
            double Pc = 0;
            //go over all predecessor states
            int nMerge = 0;
            for (j = 0; j < (int)PolicyMDP->StateArray.size(); j++) {
                for (int oind = 0; (int)PolicyMDP->StateArray[j]->Actions.size() > 0 &&
                                   oind < (int)PolicyMDP->StateArray[j]->Actions[0]->SuccsID.size(); oind++)
                {
                    if (PolicyMDP->StateArray[j]->Actions[0]->SuccsID[oind] == state->StateID) {
                        //process the predecessor
                        double PredPc = Pcvals[j];
                        double OutProb = PolicyMDP->StateArray[j]->Actions[0]->SuccsProb[oind];

                        //accumulate into Pc
                        Pc = Pc + OutProb * PredPc;
                        nMerge++;

                        //check for cycles
                        if (bFirstIter && !(*bCycles)) {
                            if (PathExists(PolicyMDP, state, PolicyMDP->StateArray[j])) *bCycles = true;
                        }
                    }
                }
            }
            if (bFirstIter && state->StateID != GoalStateID && nMerge > 0) *nMerges += (nMerge - 1);

            //assign Pc
            if (state->StateID != StartStateID) Pcvals[i] = Pc;

            if (state->StateID == GoalStateID) *Pcgoal = Pcvals[i];
        } //over  states
        bFirstIter = false;
    } //until delta small

    *PolValue = vals[startind];

    SBPL_PRINTF("done\n");
}